

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian-branching.hxx
# Opt level: O1

void __thiscall
lineage::heuristics::branching::MaskedHungarianBranching<lineage::heuristics::PartitionGraph>::setup
          (MaskedHungarianBranching<lineage::heuristics::PartitionGraph> *this)

{
  size_t *__args;
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  pointer *ppuVar4;
  pointer pVVar5;
  pointer pAVar6;
  iterator __position;
  vector<unsigned_long,std::allocator<unsigned_long>> *this_00;
  PartitionGraph *pPVar7;
  value_type v;
  vector<unsigned_long,_std::allocator<unsigned_long>_> distance;
  queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> queue;
  value_type_conflict local_e0;
  size_t local_d8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_d0;
  _Deque_base<unsigned_long,_std::allocator<unsigned_long>_> local_b8;
  vector<unsigned_long,std::allocator<unsigned_long>> *local_60;
  vector<unsigned_long,std::allocator<unsigned_long>> *local_58;
  pointer *local_50;
  pointer *local_48;
  vector<unsigned_long,std::allocator<unsigned_long>> *local_40;
  pointer *local_38;
  
  __args = &this->A_;
  sVar2 = PartitionGraph::frameOfPartition
                    ((this->super_HungarianBranching<lineage::heuristics::PartitionGraph>).
                     super_BranchingOptimizer<lineage::heuristics::PartitionGraph>.graph_,this->A_);
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur = (size_t *)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_last = (size_t *)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_cur = (size_t *)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_first = (size_t *)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_initialize_map(&local_b8,0);
  if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_b8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<unsigned_long,std::allocator<unsigned_long>>::_M_push_back_aux<unsigned_long_const&>
              ((deque<unsigned_long,std::allocator<unsigned_long>> *)&local_b8,__args);
  }
  else {
    *local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur = *__args;
    local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  if ((((this->super_HungarianBranching<lineage::heuristics::PartitionGraph>).
        super_BranchingOptimizer<lineage::heuristics::PartitionGraph>.graph_)->partitions_).
      super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[this->B_]._M_h._M_element_count != 0) {
    if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_b8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<unsigned_long,std::allocator<unsigned_long>>::
      _M_push_back_aux<unsigned_long_const&>
                ((deque<unsigned_long,std::allocator<unsigned_long>> *)&local_b8,&this->B_);
    }
    else {
      *local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur = this->B_;
      local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
           local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
    }
  }
  pPVar7 = (this->super_HungarianBranching<lineage::heuristics::PartitionGraph>).
           super_BranchingOptimizer<lineage::heuristics::PartitionGraph>.graph_;
  local_e0 = 0xffffffffffffffff;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_d0,
             (long)(pPVar7->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).
                   vertices_.
                   super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pPVar7->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).
                   vertices_.
                   super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 6,&local_e0,
             (allocator_type *)&local_d8);
  local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[*__args] = 0;
  local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[this->B_] = 0;
  if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_b8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    local_48 = &(this->third_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    local_58 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&this->third_;
    local_50 = &(this->second_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    local_60 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&this->second_;
    local_38 = &(this->first_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    local_40 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&this->first_;
    do {
      local_e0 = *local_b8._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (local_b8._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_b8._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_b8._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
        local_b8._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_b8._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_b8._M_impl.super__Deque_impl_data._M_start._M_last =
             local_b8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
        local_b8._M_impl.super__Deque_impl_data._M_start._M_first =
             local_b8._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_b8._M_impl.super__Deque_impl_data._M_start._M_node =
             local_b8._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_b8._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_b8._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      sVar3 = PartitionGraph::frameOfPartition
                        ((this->super_HungarianBranching<lineage::heuristics::PartitionGraph>).
                         super_BranchingOptimizer<lineage::heuristics::PartitionGraph>.graph_,
                         local_e0);
      if ((long)sVar3 < (long)sVar2) {
        __position._M_current =
             (this->first_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        this_00 = local_40;
        if (__position._M_current ==
            (this->first_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage) goto LAB_0013a072;
        *__position._M_current = local_e0;
        ppuVar4 = local_38;
LAB_0013a04d:
        *ppuVar4 = __position._M_current + 1;
      }
      else {
        if (sVar3 != sVar2) {
          __position._M_current =
               (this->third_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          this_00 = local_58;
          if (__position._M_current ==
              (this->third_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_0013a072;
          *__position._M_current = local_e0;
          ppuVar4 = local_48;
          goto LAB_0013a04d;
        }
        __position._M_current =
             (this->second_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        this_00 = local_60;
        if (__position._M_current !=
            (this->second_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          *__position._M_current = local_e0;
          ppuVar4 = local_50;
          goto LAB_0013a04d;
        }
LAB_0013a072:
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>(this_00,__position,&local_e0);
      }
      uVar1 = local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[local_e0];
      if (uVar1 < this->maxDistance_) {
        pPVar7 = (this->super_HungarianBranching<lineage::heuristics::PartitionGraph>).
                 super_BranchingOptimizer<lineage::heuristics::PartitionGraph>.graph_;
        pVVar5 = (pPVar7->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).vertices_.
                 super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pAVar6 = *(pointer *)&((Adjacencies *)((long)(pVVar5 + local_e0) + 0x20))->vector_;
        if (pAVar6 != *(pointer *)((long)(pVVar5 + local_e0) + 0x28)) {
          do {
            sVar3 = PartitionGraph::frameOfPartition(pPVar7,pAVar6->vertex_);
            if ((((sVar2 == sVar3) || ((sVar3 <= sVar2 && sVar2 != sVar3) && sVar2 - sVar3 == 1)) ||
                (sVar3 - sVar2 == 1 && sVar2 < sVar3)) &&
               (uVar1 + 1 <
                local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[pAVar6->vertex_])) {
              local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[pAVar6->vertex_] = uVar1 + 1;
              local_d8 = pAVar6->vertex_;
              std::deque<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                        ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&local_b8,&local_d8
                        );
            }
            pAVar6 = pAVar6 + 1;
            pPVar7 = (this->super_HungarianBranching<lineage::heuristics::PartitionGraph>).
                     super_BranchingOptimizer<lineage::heuristics::PartitionGraph>.graph_;
            pVVar5 = (pPVar7->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).
                     vertices_.
                     super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          } while (pAVar6 != *(pointer *)((long)(pVVar5 + local_e0) + 0x28));
        }
        pAVar6 = *(pointer *)&pVVar5[local_e0].from_;
        pPVar7 = (this->super_HungarianBranching<lineage::heuristics::PartitionGraph>).
                 super_BranchingOptimizer<lineage::heuristics::PartitionGraph>.graph_;
        if (pAVar6 != *(pointer *)
                       ((long)((pPVar7->
                               super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).
                               vertices_.
                               super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                               ._M_impl.super__Vector_impl_data._M_start + local_e0) + 8)) {
          do {
            sVar3 = PartitionGraph::frameOfPartition(pPVar7,pAVar6->vertex_);
            if ((((sVar2 == sVar3) || ((sVar3 <= sVar2 && sVar2 != sVar3) && sVar2 - sVar3 == 1)) ||
                (sVar3 - sVar2 == 1 && sVar2 < sVar3)) &&
               (uVar1 + 1 <
                local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[pAVar6->vertex_])) {
              local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[pAVar6->vertex_] = uVar1 + 1;
              local_d8 = pAVar6->vertex_;
              std::deque<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                        ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&local_b8,&local_d8
                        );
            }
            pAVar6 = pAVar6 + 1;
            pPVar7 = (this->super_HungarianBranching<lineage::heuristics::PartitionGraph>).
                     super_BranchingOptimizer<lineage::heuristics::PartitionGraph>.graph_;
          } while (pAVar6 != *(pointer *)
                              ((long)((pPVar7->
                                      super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>
                                      ).vertices_.
                                      super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                                      ._M_impl.super__Vector_impl_data._M_start + local_e0) + 8));
        }
      }
    } while (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_b8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  remove_duplicates<std::vector<unsigned_long,std::allocator<unsigned_long>>>(&this->first_);
  remove_duplicates<std::vector<unsigned_long,std::allocator<unsigned_long>>>(&this->second_);
  remove_duplicates<std::vector<unsigned_long,std::allocator<unsigned_long>>>(&this->third_);
  if (local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base(&local_b8);
  return;
}

Assistant:

inline void
MaskedHungarianBranching<GRAPH>::setup()
{
    const auto centerFrame = this->getFrame(A_);

    std::queue<size_t> queue;
    queue.push(A_);

    if (!this->getGraph().partitions_[B_].empty())
        queue.push(B_);

    std::vector<size_t> distance(this->getGraph().numberOfVertices(),
                                 std::numeric_limits<size_t>::max());
    distance[A_] = 0;
    distance[B_] = 0;

    auto withinMaxTimeStep = [=](size_t other) {
        if (other == centerFrame)
            return true;
        if (other < centerFrame && (centerFrame - other) == 1) {
            return true;
        } else if (other > centerFrame && (other - centerFrame) == 1) {
            return true;
        } else {
            return false;
        }
    };

    while (!queue.empty()) {

        const auto v = queue.front();
        queue.pop();

        // put the node in the correct set of nodes.
        auto const& frame = this->getFrame(v);
        if (frame < centerFrame)
            first_.emplace_back(v);
        else if (frame == centerFrame)
            second_.emplace_back(v);
        else
            third_.emplace_back(v);

        auto const currentDistance = distance[v];
        if (currentDistance >= maxDistance_) {
            continue;
        }

        // outgoing edges ...
        for (auto it = this->getGraph().verticesFromVertexBegin(v);
             it != this->getGraph().verticesFromVertexEnd(v); ++it) {

            if (!withinMaxTimeStep(this->getFrame(*it))) {
                continue;
            }

            if (distance[*it] > currentDistance + 1) {
                distance[*it] = currentDistance + 1;
                queue.push(*it);
            }
        }

        // ... and incoming edges.
        for (auto it = this->getGraph().verticesToVertexBegin(v);
             it != this->getGraph().verticesToVertexEnd(v); ++it) {

            if (!withinMaxTimeStep(this->getFrame(*it))) {
                continue;
            }

            if (distance[*it] > currentDistance + 1) {
                distance[*it] = currentDistance + 1;
                queue.push(*it);
            }
        }
    }

    // just be sure that there are no duplicates.
    remove_duplicates(first_);
    remove_duplicates(second_);
    remove_duplicates(third_);
}